

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O3

int __thiscall http::Page::Printf(Page *this,char *format,...)

{
  long lVar1;
  char in_AL;
  ulong uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vlist;
  char buffer [512];
  undefined8 local_2e8;
  void **local_2e0;
  undefined1 *local_2d8;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  char local_218 [520];
  
  local_2d8 = local_2c8;
  if (in_AL != '\0') {
    local_298 = in_XMM0_Qa;
    local_288 = in_XMM1_Qa;
    local_278 = in_XMM2_Qa;
    local_268 = in_XMM3_Qa;
    local_258 = in_XMM4_Qa;
    local_248 = in_XMM5_Qa;
    local_238 = in_XMM6_Qa;
    local_228 = in_XMM7_Qa;
  }
  local_2e0 = &vlist[0].overflow_arg_area;
  local_2e8 = 0x3000000010;
  local_2b8 = in_RDX;
  local_2b0 = in_RCX;
  local_2a8 = in_R8;
  local_2a0 = in_R9;
  vsnprintf(local_218,0x200,format,&local_2e8);
  if (local_218[0] == '\0') {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      RawSend(this,local_218 + uVar3,1);
      uVar2 = uVar3 + 1;
      if (0x1fd < uVar3) break;
      lVar1 = uVar3 + 1;
      uVar3 = uVar2;
    } while (local_218[lVar1] != '\0');
  }
  return (int)uVar2;
}

Assistant:

int http::Page::Printf(const char* format, ...)
{
    char buffer[BUFFER_SIZE];
    int i;
    va_list vlist;
    int rc;

    va_start(vlist, format);

    vsnprintf(buffer, sizeof(buffer), format, vlist);

    for (i = 0; buffer[i] && i < (int)(sizeof(buffer) - 1); i++)
    {
        RawSend(&buffer[i], 1);
    }
    rc = i;

    return rc;
}